

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_int.cc
# Opt level: O2

int ASN1_INTEGER_cmp(ASN1_INTEGER *x,ASN1_INTEGER *y)

{
  uint uVar1;
  uint uVar2;
  
  uVar2 = x->type & 0x100;
  if (uVar2 == (y->type & 0x100U)) {
    uVar1 = ASN1_STRING_cmp(x,y);
    if (uVar2 != 0) {
      if ((int)uVar1 < 0) {
        uVar1 = 1;
      }
      else {
        uVar1 = -(uint)(uVar1 != 0);
      }
    }
  }
  else {
    uVar1 = -(uint)(uVar2 != 0) | 1;
  }
  return uVar1;
}

Assistant:

int ASN1_INTEGER_cmp(const ASN1_INTEGER *x, const ASN1_INTEGER *y) {
  // Compare signs.
  int neg = x->type & V_ASN1_NEG;
  if (neg != (y->type & V_ASN1_NEG)) {
    return neg ? -1 : 1;
  }

  int ret = ASN1_STRING_cmp(x, y);
  if (neg) {
    // This could be |-ret|, but |ASN1_STRING_cmp| is not forbidden from
    // returning |INT_MIN|.
    if (ret < 0) {
      return 1;
    } else if (ret > 0) {
      return -1;
    } else {
      return 0;
    }
  }

  return ret;
}